

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log_<unsigned_long&,unsigned_int&,unsigned_long_long>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,unsigned_long *args,
          uint *args_1,unsigned_long_long *args_2)

{
  format_args args_00;
  string_view fmt_00;
  char *pcVar1;
  size_t count;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RDI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  undefined8 *in_stack_00000020;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  int ignore;
  string_view sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffab0;
  undefined8 uVar2;
  logger *in_stack_fffffffffffffab8;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffac0;
  basic_appender<char> *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffaf8;
  level_enum in_stack_fffffffffffffb1c;
  log_msg *in_stack_fffffffffffffb20;
  string_view_t in_stack_fffffffffffffb28;
  string_view_t in_stack_fffffffffffffb38;
  source_loc in_stack_fffffffffffffb50;
  basic_string_view<char> local_458 [2];
  undefined8 local_438;
  undefined8 uStack_430;
  log_msg *local_428;
  buffer<char> *local_3c0;
  undefined8 local_3b8 [2];
  undefined4 local_3a8 [4];
  undefined8 local_398 [3];
  undefined8 local_380;
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 local_368;
  basic_appender<char> local_360 [4];
  buffer<char> local_340 [9];
  undefined1 local_21a;
  byte local_219;
  undefined4 *local_218;
  undefined8 *local_210;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 *local_120;
  undefined4 *local_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  undefined4 local_f4;
  undefined4 *local_f0;
  undefined8 *local_e8;
  undefined8 *local_e0;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  pcVar1 = &stack0x00000008;
  local_218 = in_R9;
  local_210 = in_R8;
  local_1f8 = in_RDX;
  local_1f0 = in_RCX;
  local_219 = should_log(in_stack_fffffffffffffab8,
                         (level_enum)((ulong)in_stack_fffffffffffffab0 >> 0x20));
  local_21a = details::backtracer::enabled((backtracer *)0x27f17b);
  if (((local_219 & 1) != 0) || ((bool)local_21a)) {
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    basic_memory_buffer(in_stack_fffffffffffffab0,(allocator<char> *)in_stack_fffffffffffffaa8);
    ::fmt::v11::basic_appender<char>::basic_appender(local_360,local_340);
    local_370 = local_1f8;
    local_368 = local_1f0;
    local_110 = local_210;
    local_118 = local_218;
    local_120 = in_stack_00000020;
    local_108 = *local_210;
    local_100 = local_3b8;
    local_f0 = local_3a8;
    local_f4 = *local_218;
    local_18 = local_398;
    local_20 = *in_stack_00000020;
    local_e0 = &local_380;
    local_e8 = local_3b8;
    local_380 = 0x424;
    fmt_00.size_ = in_RDI;
    fmt_00.data_ = pcVar1;
    args_00.desc_._4_4_ = in_stack_fffffffffffffaf4;
    args_00.desc_._0_4_ = in_stack_fffffffffffffaf0;
    args_00.field_1.args_ = in_stack_fffffffffffffaf8.args_;
    local_10 = local_108;
    local_8 = local_100;
    local_3b8[0] = local_108;
    local_3a8[0] = local_f4;
    local_398[0] = local_20;
    local_378 = local_e8;
    local_3c0 = (buffer<char> *)
                ::fmt::v11::vformat_to<fmt::v11::basic_appender<char>,_0>
                          (in_stack_fffffffffffffae8,fmt_00,args_00);
    local_428 = *(log_msg **)(pcVar1 + 0x10);
    local_438 = *(undefined8 *)pcVar1;
    uStack_430 = *(undefined8 *)(pcVar1 + 8);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string_view<char> *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    pcVar1 = ::fmt::v11::detail::buffer<char>::data(local_340);
    count = ::fmt::v11::detail::buffer<char>::size(local_340);
    ::fmt::v11::basic_string_view<char>::basic_string_view(local_458,pcVar1,count);
    uVar2 = uStack_430;
    log_msg_00 = local_428;
    details::log_msg::log_msg
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb50,in_stack_fffffffffffffb38,
               in_stack_fffffffffffffb1c,in_stack_fffffffffffffb28);
    log_it_(in_stack_fffffffffffffac0,log_msg_00,SUB81((ulong)uVar2 >> 0x38,0),
            SUB81((ulong)uVar2 >> 0x30,0));
    ::fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::
    ~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *)0x27f454);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args) {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled) {
            return;
        }
        SPDLOG_TRY {
            memory_buf_t buf;
#ifdef SPDLOG_USE_STD_FORMAT
            fmt_lib::vformat_to(std::back_inserter(buf), fmt, fmt_lib::make_format_args(args...));
#else
            fmt::vformat_to(fmt::appender(buf), fmt, fmt::make_format_args(args...));
#endif

            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }